

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O1

void AArch64_reg_access(cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                       uint16_t *regs_write,uint8_t *regs_write_count)

{
  byte bVar1;
  cs_detail *__src;
  _Bool _Var2;
  uint8_t *puVar3;
  ulong uVar4;
  uchar max;
  byte bVar5;
  ulong uVar6;
  byte *pbVar7;
  uint local_54;
  
  __src = insn->detail;
  bVar5 = __src->regs_read_count;
  uVar6 = (ulong)bVar5;
  bVar1 = __src->regs_write_count;
  memcpy(regs_read,__src,(ulong)((uint)bVar5 * 2));
  local_54 = (uint)bVar1;
  memcpy(regs_write,insn->detail->regs_write,(ulong)(local_54 * 2));
  if ((__src->field_6).x86.opcode[2] != '\0') {
    pbVar7 = (byte *)((long)&__src->field_6 + 0x38);
    uVar4 = 0;
    do {
      max = (uchar)uVar6;
      if (*(int *)(pbVar7 + -0x18) == 3) {
        if (*(uint *)(pbVar7 + -0x10) != 0) {
          _Var2 = arr_exist(regs_read,max,*(uint *)(pbVar7 + -0x10));
          if (!_Var2) {
            regs_read[uVar6] = *(uint16_t *)(pbVar7 + -0x10);
            uVar6 = (ulong)(byte)(max + 1);
          }
        }
        if (*(uint *)(pbVar7 + -0xc) != 0) {
          _Var2 = arr_exist(regs_read,(uchar)uVar6,*(uint *)(pbVar7 + -0xc));
          if (!_Var2) {
            regs_read[uVar6] = *(uint16_t *)(pbVar7 + -0xc);
            uVar6 = (ulong)(byte)((uchar)uVar6 + 1);
          }
        }
        if (((__src->field_6).x86.opcode[1] == '\x01') && (*(uint *)(pbVar7 + -0x10) != 0)) {
          _Var2 = arr_exist(regs_write,(byte)local_54,*(uint *)(pbVar7 + -0x10));
          if (!_Var2) {
            puVar3 = __src->groups + uVar4 * 0x38 + 0x35;
LAB_0021b3f0:
            regs_write[local_54] = *(uint16_t *)puVar3;
            local_54 = (uint)(byte)((byte)local_54 + 1);
          }
        }
      }
      else if (*(int *)(pbVar7 + -0x18) == 1) {
        if ((*pbVar7 & 1) != 0) {
          _Var2 = arr_exist(regs_read,max,*(uint *)(pbVar7 + -0x10));
          if (!_Var2) {
            regs_read[uVar6] = *(uint16_t *)(pbVar7 + -0x10);
            uVar6 = (ulong)(byte)(max + 1);
          }
        }
        if ((*pbVar7 & 2) != 0) {
          _Var2 = arr_exist(regs_write,(byte)local_54,*(uint *)(pbVar7 + -0x10));
          if (!_Var2) {
            puVar3 = pbVar7 + -0x10;
            goto LAB_0021b3f0;
          }
        }
      }
      bVar5 = (byte)uVar6;
      uVar4 = uVar4 + 1;
      pbVar7 = pbVar7 + 0x38;
      bVar1 = (byte)local_54;
    } while (uVar4 < (__src->field_6).x86.opcode[2]);
  }
  local_54._0_1_ = bVar1;
  *regs_read_count = bVar5;
  *regs_write_count = (byte)local_54;
  return;
}

Assistant:

void AArch64_reg_access(const cs_insn *insn,
		cs_regs regs_read, uint8_t *regs_read_count,
		cs_regs regs_write, uint8_t *regs_write_count)
{
	uint8_t i;
	uint8_t read_count, write_count;
	cs_arm64 *arm64 = &(insn->detail->arm64);

	read_count = insn->detail->regs_read_count;
	write_count = insn->detail->regs_write_count;

	// implicit registers
	memcpy(regs_read, insn->detail->regs_read, read_count * sizeof(insn->detail->regs_read[0]));
	memcpy(regs_write, insn->detail->regs_write, write_count * sizeof(insn->detail->regs_write[0]));

	// explicit registers
	for (i = 0; i < arm64->op_count; i++) {
		cs_arm64_op *op = &(arm64->operands[i]);
		switch((int)op->type) {
			case ARM64_OP_REG:
				if ((op->access & CS_AC_READ) && !arr_exist(regs_read, read_count, op->reg)) {
					regs_read[read_count] = (uint16_t)op->reg;
					read_count++;
				}
				if ((op->access & CS_AC_WRITE) && !arr_exist(regs_write, write_count, op->reg)) {
					regs_write[write_count] = (uint16_t)op->reg;
					write_count++;
				}
				break;
			case ARM_OP_MEM:
				// registers appeared in memory references always being read
				if ((op->mem.base != ARM64_REG_INVALID) && !arr_exist(regs_read, read_count, op->mem.base)) {
					regs_read[read_count] = (uint16_t)op->mem.base;
					read_count++;
				}
				if ((op->mem.index != ARM64_REG_INVALID) && !arr_exist(regs_read, read_count, op->mem.index)) {
					regs_read[read_count] = (uint16_t)op->mem.index;
					read_count++;
				}
				if ((arm64->writeback) && (op->mem.base != ARM64_REG_INVALID) && !arr_exist(regs_write, write_count, op->mem.base)) {
					regs_write[write_count] = (uint16_t)op->mem.base;
					write_count++;
				}
			default:
				break;
		}
	}

	*regs_read_count = read_count;
	*regs_write_count = write_count;
}